

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banner.cpp
# Opt level: O1

wstring * GetTitleAndDeveloperFromSpecCommandArgument
                    (wstring *__return_storage_ptr__,wifstream *stream,wstring *command_argument)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  pointer pwVar2;
  undefined1 auVar3 [16];
  int iVar4;
  wchar_t wVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong *in_RCX;
  int iVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  wstring line;
  ulong *local_90;
  ulong *local_88;
  ulong local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  pwVar2 = (command_argument->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)__return_storage_ptr__,pwVar2,pwVar2 + command_argument->_M_string_length);
  iVar8 = 1;
  bVar9 = false;
  while( true ) {
    iVar4 = std::wistream::get();
    std::wistream::unget();
    if (iVar4 == 0x20) break;
    bVar9 = true;
LAB_00103836:
    if (iVar4 != 0x20) {
      if ((!bVar9) &&
         (pwVar2 = (__return_storage_ptr__->_M_dataplus)._M_p,
         (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
          *)pwVar2 != paVar1)) {
        operator_delete(pwVar2,paVar1->_M_allocated_capacity * 4 + 4);
      }
      return __return_storage_ptr__;
    }
  }
  if (iVar8 == 3) {
    stream = (wifstream *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_50,3);
    std::operator+(&local_70,"Title and developer can not be more than ",&local_50);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    auVar3._8_8_ = &local_80;
    auVar3._0_8_ = plVar6;
    auVar10._8_8_ = (ulong *)*plVar6;
    auVar10._0_8_ = plVar6;
    in_RCX = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == in_RCX) {
      local_80 = *in_RCX;
      lStack_78 = plVar6[3];
      goto LAB_001038ee;
    }
  }
  else {
    local_90 = &local_80;
    local_88 = (ulong *)0x0;
    local_80 = local_80 & 0xffffffff00000000;
    plVar6 = *(long **)(stream + *(long *)(*(long *)stream + -0x18) + 0xf0);
    if (plVar6 != (long *)0x0) {
      wVar5 = (**(code **)(*plVar6 + 0x50))(plVar6,10);
      std::getline<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
                ((wistream *)stream,(wstring *)&local_90,wVar5);
      std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
      std::__cxx11::wstring::find_first_not_of((wchar_t)(wstring *)&local_90,0x20);
      in_RCX = local_88;
      std::__cxx11::wstring::substr((ulong)&local_70,(ulong)&local_90);
      std::__cxx11::wstring::_M_append
                ((wchar_t *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 * 4 + 4);
      }
      iVar8 = iVar8 + 1;
      goto LAB_00103836;
    }
    auVar10 = std::__throw_bad_cast();
  }
  local_80 = *in_RCX;
  auVar3 = auVar10;
LAB_001038ee:
  local_90 = auVar3._8_8_;
  puVar7 = auVar3._0_8_;
  local_88 = (ulong *)puVar7[1];
  *puVar7 = in_RCX;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  std::runtime_error::runtime_error((runtime_error *)stream,(string *)&local_90);
  __cxa_throw(stream,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::wstring GetTitleAndDeveloperFromSpecCommandArgument(std::wifstream& stream, const std::wstring& command_argument) {
    std::wstring title_and_developer = command_argument;
    constexpr int max_lines = 3;
    int current_line = 1;

    while (true) {
        wchar_t first_char = stream.get();
        stream.unget();
        if (first_char != L' ') {
            return title_and_developer;
        }

        if (current_line++ == max_lines) {
            throw std::runtime_error("Title and developer can not be more than " + std::to_string(max_lines) + " lines");
        }

        std::wstring line;
        std::getline(stream, line);

        title_and_developer += '\n';
        title_and_developer += line.substr(line.find_first_not_of(L' '), line.size());
    }
}